

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O2

ASTNode * ParseFuncCall(Scope *scope,Lexer *lexer)

{
  Token tok;
  ASTNode *pAVar1;
  ASTNode *pAVar2;
  ASTList *pAVar3;
  char *pcVar4;
  
  tok = GetCurrentToken(lexer);
  if (tok == IDENTIFIER) {
    pAVar1 = GetNextNode(scope);
    pAVar1->type = FUNC_CALL;
    pAVar2 = FindSymbol(scope,lexer->currentTokenString);
    (pAVar1->meta).binaryExpr.left = pAVar2;
    pAVar1->isStmt = true;
    pAVar3 = ParseArgs(scope,lexer);
    (pAVar1->meta).funcCallExpr.args = pAVar3;
    return pAVar1;
  }
  pcVar4 = TokenToString(tok);
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","IDENTIFIER",pcVar4,
         (ulong)(uint)(lexer->tracker).row,
         (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
  exit(0);
}

Assistant:

ASTNode* ParseFuncCall(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Func Call");
	TRACK();
	Token tok = GetCurrentToken(lexer);
	EXPECT_TOKEN(tok, IDENTIFIER, lexer);

	ASTNode* funcCall = GetNextNode(scope);
	SET_NODE_TYPE(funcCall, FUNC_CALL);
	SET_FUNC_CALL_FUNC(funcCall, FindSymbol(scope, lexer->currentTokenString));
	SET_IS_STMT(funcCall);
	SET_FUNC_CALL_ARGS(funcCall, ParseArgs(scope, lexer));
	return funcCall;
}